

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_data.cc
# Opt level: O1

void re2c::keygen<unsigned_short>
               (FILE *f,size_t count,size_t len,size_t len_match,rule_rank_t match)

{
  int iVar1;
  size_t __n;
  unsigned_short uVar2;
  void *__ptr;
  long lVar3;
  ulong uVar4;
  undefined2 *puVar5;
  unsigned_short m;
  unsigned_short m_1;
  unsigned_short m_2;
  undefined2 local_3e;
  undefined2 local_3c;
  undefined2 local_3a;
  FILE *local_38;
  
  local_38 = (FILE *)f;
  uVar2 = Skeleton::rule2key<unsigned_short>((rule_rank_t)0x0);
  __n = count * 3;
  uVar4 = 0xffffffffffffffff;
  if (-1 < (long)__n) {
    uVar4 = count * 6;
  }
  __ptr = operator_new__(uVar4);
  if (count != 0) {
    uVar4 = 0;
    do {
      lVar3 = 0;
      puVar5 = &local_3e;
      do {
        *(char *)puVar5 = (char)(((uint)len & 0xffff) >> ((byte)lVar3 & 0x1f));
        lVar3 = lVar3 + 8;
        puVar5 = (undefined2 *)((long)puVar5 + 1);
      } while (lVar3 == 8);
      *(undefined2 *)((long)__ptr + uVar4 * 2) = local_3e;
      lVar3 = 0;
      puVar5 = &local_3c;
      do {
        *(char *)puVar5 = (char)(((uint)len_match & 0xffff) >> ((byte)lVar3 & 0x1f));
        lVar3 = lVar3 + 8;
        puVar5 = (undefined2 *)((long)puVar5 + 1);
      } while (lVar3 == 8);
      iVar1 = (int)uVar4;
      *(undefined2 *)((long)__ptr + (ulong)(iVar1 + 1) * 2) = local_3c;
      lVar3 = 0;
      puVar5 = &local_3a;
      do {
        *(char *)puVar5 = (char)(uVar2 >> ((byte)lVar3 & 0x1f));
        lVar3 = lVar3 + 8;
        puVar5 = (undefined2 *)((long)puVar5 + 1);
      } while (lVar3 == 8);
      uVar4 = (ulong)(iVar1 + 3);
      *(undefined2 *)((long)__ptr + (ulong)(iVar1 + 2) * 2) = local_3a;
    } while (uVar4 < __n);
  }
  fwrite(__ptr,2,__n,local_38);
  operator_delete__(__ptr);
  return;
}

Assistant:

static void keygen (FILE * f, size_t count, size_t len, size_t len_match, rule_rank_t match)
{
	const key_t m = Skeleton::rule2key<key_t> (match);

	const size_t keys_size = 3 * count;
	key_t * keys = new key_t [keys_size];
	for (uint32_t i = 0; i < keys_size;)
	{
		keys[i++] = to_le<key_t>(static_cast<key_t> (len));
		keys[i++] = to_le<key_t>(static_cast<key_t> (len_match));
		keys[i++] = to_le<key_t>(m);
	}
	fwrite (keys, sizeof (key_t), keys_size, f);
	delete [] keys;
}